

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

pointer __thiscall
slang::SmallVectorBase<slang::ast::ConfigBlockSymbol::TopCell>::
emplaceRealloc<slang::ast::DefinitionSymbol_const&,slang::SourceRange>
          (SmallVectorBase<slang::ast::ConfigBlockSymbol::TopCell> *this,pointer pos,
          DefinitionSymbol *args,SourceRange *args_1)

{
  SourceLocation *pSVar1;
  ulong uVar2;
  pointer p;
  SourceLocation SVar3;
  DefinitionSymbol *pDVar4;
  ConfigRule *pCVar5;
  pointer pTVar6;
  pointer pTVar7;
  pointer pTVar8;
  long lVar9;
  ulong uVar10;
  size_type sVar11;
  long lVar12;
  
  if (this->len == 0x3ffffffffffffff) {
    detail::throwLengthError();
  }
  uVar10 = this->len + 1;
  uVar2 = this->cap;
  if (uVar10 < uVar2 * 2) {
    uVar10 = uVar2 * 2;
  }
  if (0x3ffffffffffffff - uVar2 < uVar2) {
    uVar10 = 0x3ffffffffffffff;
  }
  lVar12 = (long)pos - (long)this->data_;
  pTVar6 = (pointer)operator_new(uVar10 << 5);
  *(DefinitionSymbol **)((long)pTVar6 + lVar12) = args;
  *(undefined8 *)((long)pTVar6 + lVar12 + 8) = 0;
  SVar3 = args_1->endLoc;
  pSVar1 = (SourceLocation *)((long)pTVar6 + lVar12 + 0x10);
  *pSVar1 = args_1->startLoc;
  pSVar1[1] = SVar3;
  p = this->data_;
  sVar11 = this->len;
  lVar9 = (long)p + (sVar11 * 0x20 - (long)pos);
  pTVar7 = p;
  pTVar8 = pTVar6;
  if (lVar9 == 0) {
    pTVar7 = pTVar6;
    pTVar8 = p;
    if (sVar11 != 0) {
      do {
        pDVar4 = pTVar8->definition;
        pCVar5 = pTVar8->rule;
        SVar3 = (pTVar8->sourceRange).endLoc;
        (pTVar7->sourceRange).startLoc = (pTVar8->sourceRange).startLoc;
        (pTVar7->sourceRange).endLoc = SVar3;
        pTVar7->definition = pDVar4;
        pTVar7->rule = pCVar5;
        pTVar8 = pTVar8 + 1;
        pTVar7 = pTVar7 + 1;
      } while (pTVar8 != pos);
    }
  }
  else {
    for (; pTVar7 != pos; pTVar7 = pTVar7 + 1) {
      pDVar4 = pTVar7->definition;
      pCVar5 = pTVar7->rule;
      SVar3 = (pTVar7->sourceRange).endLoc;
      (pTVar8->sourceRange).startLoc = (pTVar7->sourceRange).startLoc;
      (pTVar8->sourceRange).endLoc = SVar3;
      pTVar8->definition = pDVar4;
      pTVar8->rule = pCVar5;
      pTVar8 = pTVar8 + 1;
    }
    memcpy((void *)((long)pTVar6 + lVar12 + 0x20),pos,(lVar9 - 0x20U & 0xffffffffffffffe0) + 0x20);
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
    sVar11 = this->len;
  }
  this->len = sVar11 + 1;
  this->cap = uVar10;
  this->data_ = pTVar6;
  return (pointer)((long)pTVar6 + lVar12);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}